

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O1

void __thiscall
rapidjson::internal::Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
Expand<unsigned_long>
          (Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *this,size_t count)

{
  char *originalPtr;
  char *pcVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_00;
  char *newSize;
  long lVar2;
  
  pcVar1 = this->stack_;
  if (pcVar1 == (char *)0x0) {
    if (this->allocator_ == (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
      this_00 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)operator_new(0x18);
      MemoryPoolAllocator<rapidjson::CrtAllocator>::MemoryPoolAllocator
                (this_00,0x10000,(CrtAllocator *)0x0);
      this->allocator_ = this_00;
      this->ownAllocator_ = this_00;
    }
    pcVar1 = (char *)this->initialCapacity_;
  }
  else {
    pcVar1 = this->stackEnd_ + (((ulong)(this->stackEnd_ + (1 - (long)pcVar1)) >> 1) - (long)pcVar1)
    ;
  }
  originalPtr = this->stack_;
  lVar2 = (long)this->stackTop_ - (long)originalPtr;
  newSize = (char *)(lVar2 + count * 8);
  if (newSize < pcVar1) {
    newSize = pcVar1;
  }
  pcVar1 = (char *)MemoryPoolAllocator<rapidjson::CrtAllocator>::Realloc
                             (this->allocator_,originalPtr,(long)this->stackEnd_ - (long)originalPtr
                              ,(size_t)newSize);
  this->stack_ = pcVar1;
  this->stackTop_ = pcVar1 + lVar2;
  this->stackEnd_ = pcVar1 + (long)newSize;
  return;
}

Assistant:

void Expand(size_t count) {
        // Only expand the capacity if the current stack exists. Otherwise just create a stack with initial capacity.
        size_t newCapacity;
        if (stack_ == 0) {
            if (!allocator_)
                ownAllocator_ = allocator_ = RAPIDJSON_NEW(Allocator)();
            newCapacity = initialCapacity_;
        } else {
            newCapacity = GetCapacity();
            newCapacity += (newCapacity + 1) / 2;
        }
        size_t newSize = GetSize() + sizeof(T) * count;
        if (newCapacity < newSize)
            newCapacity = newSize;

        Resize(newCapacity);
    }